

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::createGarbageGridMesh
          (int hash,size_t numGrids,bool mblur,Ref<embree::SceneGraph::MaterialNode> *material)

{
  undefined8 uVar1;
  BBox1f time_range;
  ulong uVar2;
  uint uVar3;
  _func_int **pp_Var4;
  reference pvVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  Vec3fa *pVVar8;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  Node *in_RDI;
  long *in_R8;
  float w_1;
  float z_1;
  float y_1;
  float x_1;
  size_t i_10;
  float w;
  float z;
  float y;
  float x;
  size_t i_5;
  uint v0;
  size_t i;
  Ref<embree::SceneGraph::GridMeshNode> mesh;
  RandomSampler sampler;
  uint hash_1;
  anon_union_4_2_947300a4 v_7;
  anon_union_4_2_947300a4 v_6;
  anon_union_4_2_947300a4 v_5;
  anon_union_4_2_947300a4 v_4;
  anon_union_4_2_947300a4 v_3;
  anon_union_4_2_947300a4 v_2;
  anon_union_4_2_947300a4 v_1;
  anon_union_4_2_947300a4 v;
  uint n;
  uint m;
  uint r2;
  uint r1;
  uint c2;
  uint c1;
  uint n_2;
  uint m_2;
  uint n_3;
  uint m_3;
  uint n_4;
  uint m_4;
  uint n_5;
  uint m_5;
  uint n_6;
  uint m_6;
  uint n_7;
  uint m_7;
  uint n_8;
  uint m_8;
  uint n_9;
  uint m_9;
  uint n_10;
  uint m_10;
  uint n_1;
  uint m_1;
  size_t i_4;
  size_t i_3;
  Vec3fa *old_items;
  size_t i_2;
  size_t i_1;
  size_t i_9;
  size_t i_8;
  Vec3fa *old_items_1;
  size_t i_7;
  size_t i_6;
  size_t new_size_alloced;
  size_t new_size_alloced_1;
  void *in_stack_fffffffffffff938;
  size_t in_stack_fffffffffffff940;
  size_t in_stack_fffffffffffff948;
  size_type in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  size_t in_stack_fffffffffffff9b8;
  undefined4 in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c4;
  undefined4 in_stack_fffffffffffff9c8;
  undefined4 in_stack_fffffffffffff9cc;
  float in_stack_fffffffffffff9d0;
  float in_stack_fffffffffffff9d4;
  uint local_5d4;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  uint local_560;
  uint local_55c;
  uint local_558;
  uint local_554;
  ulong local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  uint local_520;
  uint local_51c;
  uint local_518;
  uint local_514;
  ulong local_510;
  Grid local_508;
  uint local_4fc;
  ulong local_4f8;
  undefined1 local_4ed;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined4 local_4e4;
  undefined4 uStack_4e0;
  long *local_4d0;
  _func_int **local_4c8;
  uint local_4bc [4];
  byte local_4a9;
  ulong local_4a8;
  long **local_488;
  undefined4 *local_480;
  undefined4 *local_478;
  undefined4 *local_470;
  long **local_468;
  ulong local_458;
  reference local_450;
  ulong local_448;
  reference local_440;
  ulong local_438;
  reference local_430;
  ulong local_428;
  reference local_420;
  _func_int **local_418;
  _func_int ***local_410;
  _func_int ***local_408;
  _func_int ***local_400;
  _func_int ***local_3f8;
  _func_int ***local_3f0;
  _func_int ***local_3e8;
  _func_int ***local_3e0;
  _func_int ***local_3d8;
  _func_int ***local_3c8;
  undefined8 *local_3b8;
  Vec3fa *local_3b0;
  undefined8 *local_3a8;
  Vec3fa *local_3a0;
  undefined8 *local_398;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  uint local_378;
  uint *local_370;
  uint *local_368;
  uint *local_360;
  uint *local_358;
  uint *local_350;
  uint *local_348;
  uint *local_340;
  uint *local_338;
  uint *local_330;
  uint *local_328;
  uint *local_320;
  uint local_318;
  uint local_314;
  uint local_310;
  uint local_30c;
  uint local_308;
  uint local_304;
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  uint local_2e0;
  uint local_2dc;
  uint local_2d8;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  undefined8 *local_2c8;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  undefined8 *local_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 *local_270;
  undefined8 local_268;
  undefined8 uStack_260;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  undefined8 local_248;
  undefined8 uStack_240;
  uint local_22c;
  uint local_228;
  uint local_224;
  uint local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  uint local_204;
  uint local_200;
  uint local_1fc;
  undefined4 local_1f8;
  undefined4 local_1f4;
  uint local_1f0;
  undefined4 local_1ec;
  undefined4 local_1e8;
  uint local_1e4;
  undefined4 local_1e0;
  undefined4 local_1dc;
  int local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  int local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  int local_1c0;
  undefined4 local_1bc;
  undefined4 local_1b8;
  uint local_1b4;
  undefined4 local_1b0;
  undefined4 local_1ac;
  int local_1a8;
  undefined4 local_1a4;
  undefined4 local_1a0;
  int local_19c;
  undefined4 local_198;
  undefined4 local_194;
  int local_190;
  undefined4 local_18c;
  undefined4 local_188;
  uint local_184;
  ulong local_180;
  ulong local_178;
  Vec3fa *local_170;
  ulong local_168;
  ulong local_160;
  size_t local_158;
  ulong local_150;
  reference local_148;
  Vec3fa *local_140;
  Vec3fa *local_138;
  Vec3fa *local_130;
  Vec3fa *local_128;
  size_t local_120;
  Vec3fa *local_118;
  reference local_110;
  size_t local_108;
  reference local_100;
  ulong local_f8;
  ulong local_f0;
  Vec3fa *local_e8;
  ulong local_e0;
  ulong local_d8;
  size_t local_d0;
  ulong local_c8;
  reference local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  Vec3fa *local_a8;
  Vec3fa *local_a0;
  size_t local_98;
  Vec3fa *local_90;
  reference local_88;
  size_t local_80;
  reference local_78;
  unsigned_long local_70 [2];
  ulong local_60;
  ulong local_58;
  reference local_50;
  size_t local_48;
  unsigned_long local_40 [2];
  ulong local_30;
  ulong local_28;
  reference local_20;
  size_t local_18;
  _func_int **local_10;
  
  local_4a9 = in_CL & 1;
  local_370 = local_4bc;
  local_208 = 0xcc9e2d51;
  local_20c = 0x1b873593;
  local_210 = 0xf;
  local_214 = 0xd;
  local_218 = 5;
  local_21c = 0xe6546b64;
  uVar3 = in_ESI * 0x16a88000 | (uint)(in_ESI * -0x3361d2af) >> 0x11;
  local_204 = uVar3 * 0x1b873593;
  local_200 = (uVar3 * -0x194da000 | local_204 >> 0x13) * 5 + 0xe6546b64;
  uVar3 = (local_200 >> 0x10 ^ local_200) * -0x7a143595;
  local_378 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
  local_378 = local_378 >> 0x10 ^ local_378;
  local_4a8 = in_RDX;
  local_1fc = local_378;
  local_4bc[0] = local_378;
  pp_Var4 = (_func_int **)::operator_new(0xa8);
  local_4ed = 1;
  local_488 = &local_4d0;
  local_4d0 = (long *)*in_R8;
  if (local_4d0 != (long *)0x0) {
    (**(code **)(*local_4d0 + 0x10))();
  }
  local_4e8 = 0;
  local_4ec = 0x3f800000;
  local_470 = &local_4e4;
  local_478 = &local_4e8;
  local_480 = &local_4ec;
  local_4e4 = 0;
  uStack_4e0 = 0x3f800000;
  time_range.upper = in_stack_fffffffffffff9d4;
  time_range.lower = in_stack_fffffffffffff9d0;
  GridMeshNode::GridMeshNode
            ((GridMeshNode *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
             (Ref<embree::SceneGraph::MaterialNode> *)
             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),time_range,
             in_stack_fffffffffffff9b8);
  local_4ed = 0;
  local_410 = &local_4c8;
  local_418 = pp_Var4;
  local_4c8 = pp_Var4;
  if (pp_Var4 != (_func_int **)0x0) {
    (**(code **)(*pp_Var4 + 0x10))();
  }
  local_468 = &local_4d0;
  if (local_4d0 != (long *)0x0) {
    (**(code **)(*local_4d0 + 0x18))();
  }
  local_3e0 = &local_4c8;
  std::
  vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
  ::resize((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
            *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
           in_stack_fffffffffffff958);
  for (local_4f8 = 0; local_4f8 < local_4a8; local_4f8 = local_4f8 + 1) {
    local_368 = local_4bc;
    local_184 = local_4bc[0];
    local_188 = 0x19660d;
    local_18c = 0x3c6ef35f;
    uVar3 = local_4bc[0] * 0x19660d + 0x3c6ef35f;
    if ((local_4bc[0] >> 1) % 0x20 == 0) {
      local_320 = local_4bc;
      local_1f4 = 0x19660d;
      local_1f8 = 0x3c6ef35f;
      local_5d4 = local_4bc[0];
      local_1f0 = uVar3;
      local_4bc[0] = uVar3 * 0x19660d + 0x3c6ef35f;
    }
    else {
      local_5d4 = (uint)(local_4f8 << 2);
      local_4bc[0] = uVar3;
    }
    local_4fc = local_5d4;
    GridMeshNode::Grid::Grid(&local_508,local_5d4,2,2,2);
    local_3e8 = &local_4c8;
    pvVar5 = std::
             vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
             ::operator[]((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                           *)(local_4c8 + 0x11),local_4f8);
    pvVar5->startVtx = local_508.startVtx;
    pvVar5->lineStride = local_508.lineStride;
    pvVar5->resX = local_508.resX;
    pvVar5->resY = local_508.resY;
  }
  local_3f0 = &local_4c8;
  pvVar6 = std::
           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                         *)(local_4c8 + 0xe),0);
  local_150 = local_4a8 << 2;
  local_448 = local_150;
  local_440 = pvVar6;
  local_58 = local_150;
  local_50 = pvVar6;
  if (pvVar6->size_alloced < local_150) {
    local_48 = local_150;
    if (pvVar6->size_alloced != 0) {
      local_60 = pvVar6->size_alloced;
      while (local_60 < local_58) {
        local_70[1] = 1;
        local_70[0] = local_60 << 1;
        puVar7 = std::max<unsigned_long>(local_70 + 1,local_70);
        local_60 = *puVar7;
      }
      local_48 = local_60;
    }
  }
  else {
    local_48 = pvVar6->size_alloced;
  }
  local_158 = local_48;
  uVar2 = local_150;
  if (local_150 < pvVar6->size_active) {
    while (local_160 = uVar2, local_160 < pvVar6->size_active) {
      uVar2 = local_160 + 1;
    }
    pvVar6->size_active = local_150;
  }
  local_148 = pvVar6;
  if (local_48 == pvVar6->size_alloced) {
    for (local_168 = pvVar6->size_active; local_168 < local_150; local_168 = local_168 + 1) {
      local_140 = pvVar6->items + local_168;
    }
    pvVar6->size_active = local_150;
  }
  else {
    local_170 = pvVar6->items;
    local_108 = local_48;
    local_100 = pvVar6;
    pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
    pvVar6->items = pVVar8;
    for (local_178 = 0; local_178 < pvVar6->size_active; local_178 = local_178 + 1) {
      local_128 = pvVar6->items + local_178;
      local_130 = local_170 + local_178;
      uVar1 = *(undefined8 *)((long)&local_130->field_0 + 8);
      *(undefined8 *)&local_128->field_0 = *(undefined8 *)&local_130->field_0;
      *(undefined8 *)((long)&local_128->field_0 + 8) = uVar1;
    }
    for (local_180 = pvVar6->size_active; local_180 < local_150; local_180 = local_180 + 1) {
      local_138 = pvVar6->items + local_180;
    }
    local_120 = pvVar6->size_alloced;
    local_118 = local_170;
    local_110 = pvVar6;
    alignedFree(in_stack_fffffffffffff938);
    pvVar6->size_active = local_150;
    pvVar6->size_alloced = local_158;
  }
  for (local_510 = 0; local_510 < local_4a8 << 2; local_510 = local_510 + 1) {
    local_328 = local_4bc;
    local_1e4 = local_4bc[0];
    local_1e8 = 0x19660d;
    local_1ec = 0x3c6ef35f;
    local_1d8 = local_4bc[0] * 0x19660d + 0x3c6ef35f;
    local_514 = local_4bc[0];
    local_330 = local_4bc;
    local_1dc = 0x19660d;
    local_1e0 = 0x3c6ef35f;
    local_1cc = local_1d8 * 0x19660d + 0x3c6ef35f;
    local_518 = local_4bc[0];
    local_338 = local_4bc;
    local_1d0 = 0x19660d;
    local_1d4 = 0x3c6ef35f;
    local_1c0 = local_1cc * 0x19660d + 0x3c6ef35f;
    local_51c = local_4bc[0];
    local_340 = local_4bc;
    local_1c4 = 0x19660d;
    local_1c8 = 0x3c6ef35f;
    local_520 = local_4bc[0];
    local_2c8 = &local_548;
    local_2a8 = CONCAT44(local_4bc[0],local_4bc[0]);
    uStack_2a0 = CONCAT44(local_4bc[0],local_4bc[0]);
    local_380 = &local_538;
    local_388 = &local_548;
    local_290 = &local_538;
    local_3f8 = &local_4c8;
    local_2f8 = local_520;
    local_2f4 = local_520;
    local_2f0 = local_51c;
    local_2ec = local_51c;
    local_2e8 = local_518;
    local_2e4 = local_518;
    local_2e0 = local_514;
    local_2dc = local_514;
    local_2d8 = local_520;
    local_2d4 = local_51c;
    local_2d0 = local_518;
    local_2cc = local_514;
    local_248 = local_2a8;
    uStack_240 = uStack_2a0;
    local_22c = local_514;
    local_228 = local_518;
    local_224 = local_51c;
    local_220 = local_520;
    local_548 = local_2a8;
    uStack_540 = uStack_2a0;
    local_538 = local_2a8;
    uStack_530 = uStack_2a0;
    local_4bc[0] = local_1c0 * 0x19660d + 0x3c6ef35f;
    local_420 = std::
                vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              *)(local_4c8 + 0xe),0);
    local_428 = local_510;
    local_3a0 = local_420->items + local_510;
    local_3a8 = &local_538;
    *(undefined8 *)&local_3a0->field_0 = local_538;
    *(undefined8 *)((long)&local_3a0->field_0 + 8) = uStack_530;
  }
  if ((local_4a9 & 1) != 0) {
    local_400 = &local_4c8;
    pvVar6 = std::
             vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           *)(local_4c8 + 0xe),1);
    local_c8 = local_4a8 << 2;
    local_458 = local_c8;
    local_450 = pvVar6;
    local_28 = local_c8;
    local_20 = pvVar6;
    if (pvVar6->size_alloced < local_c8) {
      local_18 = local_c8;
      if (pvVar6->size_alloced != 0) {
        local_30 = pvVar6->size_alloced;
        while (local_30 < local_28) {
          local_40[1] = 1;
          local_40[0] = local_30 << 1;
          puVar7 = std::max<unsigned_long>(local_40 + 1,local_40);
          local_30 = *puVar7;
        }
        local_18 = local_30;
      }
    }
    else {
      local_18 = pvVar6->size_alloced;
    }
    local_d0 = local_18;
    uVar2 = local_c8;
    if (local_c8 < pvVar6->size_active) {
      while (local_d8 = uVar2, local_d8 < pvVar6->size_active) {
        uVar2 = local_d8 + 1;
      }
      pvVar6->size_active = local_c8;
    }
    local_c0 = pvVar6;
    if (local_18 == pvVar6->size_alloced) {
      for (local_e0 = pvVar6->size_active; local_e0 < local_c8; local_e0 = local_e0 + 1) {
        local_b8 = pvVar6->items + local_e0;
      }
      pvVar6->size_active = local_c8;
    }
    else {
      local_e8 = pvVar6->items;
      local_80 = local_18;
      local_78 = pvVar6;
      pVVar8 = (Vec3fa *)alignedMalloc(in_stack_fffffffffffff948,in_stack_fffffffffffff940);
      pvVar6->items = pVVar8;
      for (local_f0 = 0; local_f0 < pvVar6->size_active; local_f0 = local_f0 + 1) {
        local_a0 = pvVar6->items + local_f0;
        local_a8 = local_e8 + local_f0;
        uVar1 = *(undefined8 *)((long)&local_a8->field_0 + 8);
        *(undefined8 *)&local_a0->field_0 = *(undefined8 *)&local_a8->field_0;
        *(undefined8 *)((long)&local_a0->field_0 + 8) = uVar1;
      }
      for (local_f8 = pvVar6->size_active; local_f8 < local_c8; local_f8 = local_f8 + 1) {
        local_b0 = pvVar6->items + local_f8;
      }
      local_98 = pvVar6->size_alloced;
      local_90 = local_e8;
      local_88 = pvVar6;
      alignedFree(in_stack_fffffffffffff938);
      pvVar6->size_active = local_c8;
      pvVar6->size_alloced = local_d0;
    }
    for (local_550 = 0; local_550 < local_4a8 << 2; local_550 = local_550 + 1) {
      local_348 = local_4bc;
      local_1b4 = local_4bc[0];
      local_1b8 = 0x19660d;
      local_1bc = 0x3c6ef35f;
      local_1a8 = local_4bc[0] * 0x19660d + 0x3c6ef35f;
      local_554 = local_4bc[0];
      local_350 = local_4bc;
      local_1ac = 0x19660d;
      local_1b0 = 0x3c6ef35f;
      local_19c = local_1a8 * 0x19660d + 0x3c6ef35f;
      local_558 = local_4bc[0];
      local_358 = local_4bc;
      local_1a0 = 0x19660d;
      local_1a4 = 0x3c6ef35f;
      local_190 = local_19c * 0x19660d + 0x3c6ef35f;
      local_55c = local_4bc[0];
      local_360 = local_4bc;
      local_194 = 0x19660d;
      local_198 = 0x3c6ef35f;
      local_560 = local_4bc[0];
      local_2b0 = &local_588;
      local_288 = CONCAT44(local_4bc[0],local_4bc[0]);
      uStack_280 = CONCAT44(local_4bc[0],local_4bc[0]);
      local_390 = &local_578;
      local_398 = &local_588;
      local_270 = &local_578;
      local_408 = &local_4c8;
      local_318 = local_560;
      local_314 = local_560;
      local_310 = local_55c;
      local_30c = local_55c;
      local_308 = local_558;
      local_304 = local_558;
      local_300 = local_554;
      local_2fc = local_554;
      local_2c0 = local_560;
      local_2bc = local_55c;
      local_2b8 = local_558;
      local_2b4 = local_554;
      local_268 = local_288;
      uStack_260 = uStack_280;
      local_258 = local_554;
      local_254 = local_558;
      local_250 = local_55c;
      local_24c = local_560;
      local_588 = local_288;
      uStack_580 = uStack_280;
      local_578 = local_288;
      uStack_570 = uStack_280;
      local_4bc[0] = local_190 * 0x19660d + 0x3c6ef35f;
      local_430 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                *)(local_4c8 + 0xe),1);
      local_438 = local_550;
      local_3b0 = local_430->items + local_550;
      local_3b8 = &local_578;
      *(undefined8 *)&local_3b0->field_0 = local_578;
      *(undefined8 *)((long)&local_3b0->field_0 + 8) = uStack_570;
    }
  }
  local_3d8 = &local_4c8;
  local_10 = local_4c8;
  (in_RDI->super_RefCount)._vptr_RefCount = local_4c8;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  local_3c8 = &local_4c8;
  if (local_4c8 != (_func_int **)0x0) {
    (**(code **)(*local_4c8 + 0x18))();
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGarbageGridMesh (int hash, size_t numGrids, bool mblur, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),mblur?2:1);

    mesh->grids.resize(numGrids);
    for (size_t i=0; i<numGrids; i++) {
      const unsigned v0 = (RandomSampler_getInt(sampler) % 32 == 0) ? RandomSampler_getUInt(sampler) : unsigned(4*i+0);
      mesh->grids[i] = GridMeshNode::Grid(v0,2,2,2);
    }

    mesh->positions[0].resize(4*numGrids);
    for (size_t i=0; i<4*numGrids; i++) {
      const float x = cast_i2f(RandomSampler_getUInt(sampler));
      const float y = cast_i2f(RandomSampler_getUInt(sampler));
      const float z = cast_i2f(RandomSampler_getUInt(sampler));
      const float w = cast_i2f(RandomSampler_getUInt(sampler));
      mesh->positions[0][i] = Vec3fa(Vec3ff(x,y,z,w));
    }

    if (mblur) 
    {
      mesh->positions[1].resize(4*numGrids);
      for (size_t i=0; i<4*numGrids; i++) {
        const float x = cast_i2f(RandomSampler_getUInt(sampler));
        const float y = cast_i2f(RandomSampler_getUInt(sampler));
        const float z = cast_i2f(RandomSampler_getUInt(sampler));
        const float w = cast_i2f(RandomSampler_getUInt(sampler));
        mesh->positions[1][i] = Vec3fa(Vec3ff(x,y,z,w));
      }
    }

    return mesh.dynamicCast<SceneGraph::Node>();
  }